

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Vec_Ptr_t * Scl_LibertyReadPinTimingAll(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Scl_Item_t *Entry;
  Scl_Item_t *pSVar2;
  char *__s1;
  int *piVar3;
  
  p_00 = Vec_PtrAlloc(0x10);
  piVar3 = &pPinOut->Child;
  while( true ) {
    Entry = Scl_LibertyItem(p,*piVar3);
    if (Entry == (Scl_Item_t *)0x0) break;
    iVar1 = Scl_LibertyCompare(p,Entry->Key,"timing");
    if (iVar1 == 0) {
      piVar3 = &Entry->Child;
      while( true ) {
        pSVar2 = Scl_LibertyItem(p,*piVar3);
        if (pSVar2 == (Scl_Item_t *)0x0) break;
        iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"related_pin");
        if (iVar1 == 0) {
          __s1 = Scl_LibertyReadString(p,pSVar2->Head);
          iVar1 = strcmp(__s1,pNameIn);
          if (iVar1 == 0) {
            Vec_PtrPush(p_00,Entry);
          }
        }
        piVar3 = &pSVar2->Next;
      }
    }
    piVar3 = &Entry->Next;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Scl_LibertyReadPinTimingAll( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Vec_Ptr_t * vTimings;
    Scl_Item_t * pTiming, * pPinIn;
    vTimings = Vec_PtrAlloc( 16 );
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                Vec_PtrPush( vTimings, pTiming );
    return vTimings;
}